

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void QConcatenable<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  HexString<unsigned_char> *in_RSI;
  type *in_stack_ffffffffffffffe8;
  
  QConcatenable<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>_>::appendTo<QChar>
            (in_stack_ffffffffffffffe8,(QChar **)0x5b7f11);
  QConcatenable<HexString<unsigned_char>_>::appendTo(in_RSI,(QChar **)in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }